

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::zeroBoundaryVisc
          (PeleLM *this,MultiFab **beta,Real param_2,int state_comp,int dst_comp,int ncomp)

{
  uint uVar1;
  undefined8 uVar2;
  int dir;
  long lVar3;
  Box bx;
  MFIter mfi;
  int local_ec [2];
  undefined8 uStack_e4;
  MFIter local_d0;
  Array4<double> local_70;
  
  lVar3 = 0;
  do {
    uStack_e4 = *(undefined8 *)
                 ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect + 2);
    local_ec[1] = (int)((ulong)*(undefined8 *)
                                (this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.
                                vect >> 0x20);
    uVar2 = uStack_e4;
    local_ec[0] = (int)((ulong)*(undefined8 *)
                                ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.
                                 vect + 2) >> 0x20);
    uStack_e4._4_4_ = (uint)((ulong)uStack_e4 >> 0x20);
    uVar1 = uStack_e4._4_4_ >> ((uint)lVar3 & 0x1f);
    uStack_e4 = uVar2;
    if ((uVar1 & 1) == 0) {
      local_ec[lVar3] = local_ec[lVar3] + 1;
    }
    amrex::MFIter::MFIter(&local_d0,(FabArrayBase *)beta[lVar3],true);
    while (local_d0.currentIndex < local_d0.endIndex) {
      amrex::MFIter::growntilebox((Box *)&local_70,&local_d0,-1000000);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_70,&beta[lVar3]->super_FabArray<amrex::FArrayBox>,&local_d0,dst_comp);
      amrex::MFIter::operator++(&local_d0);
    }
    amrex::MFIter::~MFIter(&local_d0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void
PeleLM::zeroBoundaryVisc (MultiFab*  beta[AMREX_SPACEDIM],
                          const Real /*time*/,
                          const int  state_comp,
                          const int  dst_comp,
                          const int  ncomp) const
{
  AMREX_ASSERT(state_comp > Density);

  const auto geomdata = geom.data();

  for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
  {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
      const Box edom = amrex::surroundingNodes(geom.Domain(),dir);
      for (MFIter mfi(*(beta[dir]),TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
        const Box& ebox     = amrex::surroundingNodes(mfi.growntilebox(),dir);
        auto const& beta_arr = beta[dir]->array(mfi,dst_comp);
        amrex::ParallelFor(ebox, [beta_arr,dir,geomdata,edom,state_comp,ncomp]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
          zero_visc(i, j, k, beta_arr, geomdata, edom, dir, state_comp, ncomp);
        });
      }
    }
  }
}